

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::iteratorAccessTest<true>(ViewTest *this)

{
  int *data;
  reference piVar1;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar2;
  reference piVar3;
  int i;
  uint uVar4;
  long lVar5;
  bool local_e9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  iterator local_d0;
  iterator it;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  data = this->data_;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_d0,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar5 = 1; lVar5 != 0x19; lVar5 = lVar5 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_d0.view_._0_1_ = *piVar1 == this->data_[lVar5 + -1];
    test((bool *)&local_d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_d0,&v);
  local_e9 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                       ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_d0);
  test(&local_e9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_d0.view_._0_1_ = *piVar1 == 0x17;
  test((bool *)&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::rbegin((reverse_iterator *)&local_d0,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (uVar4 = 0x17; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
    piVar3 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
             operator*((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                        *)&it);
    local_d0.view_._0_1_ = *piVar3 == data[uVar4];
    test((bool *)&local_d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::rend((reverse_iterator *)&local_d0,&v);
  local_e9 = std::operator==((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                              *)&it,(reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                     *)&local_d0);
  test(&local_e9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  piVar3 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
           operator*((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                      *)&it);
  local_d0.view_._0_1_ = *piVar3 == 0;
  test((bool *)&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_d0,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar5 = 1; lVar5 != 0x19; lVar5 = lVar5 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_d0.view_._0_1_ = *piVar1 == this->data_[lVar5 + -1];
    test((bool *)&local_d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_d0,&v);
  local_e9 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                       ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_d0);
  test(&local_e9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_d0.view_._0_1_ = *piVar1 == 0x17;
  test((bool *)&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_d0,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar5 = 1; lVar5 != 0x19; lVar5 = lVar5 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_d0.view_._0_1_ = *piVar1 == this->data_[lVar5 + -1];
    test((bool *)&local_d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_d0,&v);
  local_e9 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                       ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_d0);
  test(&local_e9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_d0.view_._0_1_ = *piVar1 == 0x17;
  test((bool *)&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::rbegin((reverse_iterator *)&local_d0,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (uVar4 = 0x17; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
    piVar3 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
             operator*((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                        *)&it);
    local_d0.view_._0_1_ = *piVar3 == data[uVar4];
    test((bool *)&local_d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::rend((reverse_iterator *)&local_d0,&v);
  local_e9 = std::operator==((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                              *)&it,(reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                     *)&local_d0);
  test(&local_e9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  piVar3 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
           operator*((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                      *)&it);
  local_d0.view_._0_1_ = *piVar3 == 0;
  test((bool *)&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_d0,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar5 = 1; lVar5 != 0x19; lVar5 = lVar5 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_d0.view_._0_1_ = *piVar1 == this->data_[lVar5 + -1];
    test((bool *)&local_d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_d0,&v);
  local_e9 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                       ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_d0);
  test(&local_e9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_d0.view_._0_1_ = *piVar1 == 0x17;
  test((bool *)&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_d0,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar5 = 1; lVar5 != 0x19; lVar5 = lVar5 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_d0.view_._0_1_ = *piVar1 == this->data_[lVar5 + -1];
    test((bool *)&local_d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_d0,&v);
  local_e9 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                       ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_d0);
  test(&local_e9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_d0.view_._0_1_ = *piVar1 == 0x17;
  test((bool *)&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::rbegin((reverse_iterator *)&local_d0,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (uVar4 = 0x17; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
    piVar3 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
             operator*((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                        *)&it);
    local_d0.view_._0_1_ = *piVar3 == data[uVar4];
    test((bool *)&local_d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::rend((reverse_iterator *)&local_d0,&v);
  local_e9 = std::operator==((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                              *)&it,(reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                     *)&local_d0);
  test(&local_e9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  piVar3 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
           operator*((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                      *)&it);
  local_d0.view_._0_1_ = *piVar3 == 0;
  test((bool *)&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_d0,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar5 = 1; lVar5 != 0x19; lVar5 = lVar5 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_d0.view_._0_1_ = *piVar1 == this->data_[lVar5 + -1];
    test((bool *)&local_d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_d0,&v);
  local_e9 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                       ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_d0);
  test(&local_e9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_d0.view_._0_1_ = *piVar1 == 0x17;
  test((bool *)&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ViewTest::iteratorAccessTest(){
    // 1D
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // const
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
    // 2D
    {
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // const
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
    // 3D
    {
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // cosnt
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
}